

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_swap_asi(DisasContext_conflict8 *dc,TCGv_i32 dst,TCGv_i32 src,TCGv_i32 addr,int insn)

{
  DisasASI DVar1;
  
  DVar1 = get_asi(dc,insn,MO_BEUL);
  if (DVar1.type == GET_ASI_EXCP) {
    return;
  }
  if (DVar1.type == GET_ASI_DIRECT) {
    gen_swap(dc,dst,src,addr,DVar1.mem_idx,DVar1.memop);
    return;
  }
  gen_exception(dc,0x32);
  return;
}

Assistant:

static void gen_swap_asi(DisasContext *dc, TCGv dst, TCGv src,
                         TCGv addr, int insn)
{
    DisasASI da = get_asi(dc, insn, MO_TEUL);

    switch (da.type) {
    case GET_ASI_EXCP:
        break;
    case GET_ASI_DIRECT:
        gen_swap(dc, dst, src, addr, da.mem_idx, da.memop);
        break;
    default:
        /* ??? Should be DAE_invalid_asi.  */
        gen_exception(dc, TT_DATA_ACCESS);
        break;
    }
}